

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

BuiltinDecl *
jsonnet::internal::jsonnet_builtin_decl(BuiltinDecl *__return_storage_ptr__,unsigned_long builtin)

{
  ostream *poVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_24;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_25;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_26;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_27;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_28;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_29;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_30;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_31;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_32;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_33;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_34;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_35;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_36;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_37;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_38;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_39;
  allocator<char32_t> local_85;
  allocator<char32_t> local_84;
  allocator<char32_t> local_83;
  allocator_type local_82;
  allocator_type local_81;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_80;
  u32string local_60 [32];
  u32string local_40 [32];
  
  switch(builtin) {
  case 0:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"makeArray",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"sz",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"func",&local_85);
    __l._M_len = 2;
    __l._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 1:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"pow",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"n",&local_85);
    __l_19._M_len = 2;
    __l_19._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_19,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 2:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"floor",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_15._M_len = 1;
    __l_15._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_15,(allocator_type *)&local_85);
    break;
  case 3:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"ceil",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_17._M_len = 1;
    __l_17._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_17,(allocator_type *)&local_85);
    break;
  case 4:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"sqrt",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_09._M_len = 1;
    __l_09._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_09,(allocator_type *)&local_85);
    break;
  case 5:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"sin",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_23._M_len = 1;
    __l_23._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_23,(allocator_type *)&local_85);
    break;
  case 6:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"cos",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_26._M_len = 1;
    __l_26._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_26,(allocator_type *)&local_85);
    break;
  case 7:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"tan",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_18._M_len = 1;
    __l_18._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_18,(allocator_type *)&local_85);
    break;
  case 8:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"asin",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_29._M_len = 1;
    __l_29._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_29,(allocator_type *)&local_85);
    break;
  case 9:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"acos",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_12._M_len = 1;
    __l_12._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_12,(allocator_type *)&local_85);
    break;
  case 10:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"atan",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_28._M_len = 1;
    __l_28._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_28,(allocator_type *)&local_85);
    break;
  case 0xb:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"type",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_08._M_len = 1;
    __l_08._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_08,(allocator_type *)&local_85);
    break;
  case 0xc:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"filter",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"func",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"arr",&local_85);
    __l_11._M_len = 2;
    __l_11._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_11,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0xd:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"objectHasEx",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"obj",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"f",&local_85);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (local_40,L"inc_hidden",(allocator<char32_t> *)&local_82);
    __l_25._M_len = 3;
    __l_25._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_25,&local_81);
    lVar2 = 0x40;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0xe:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"length",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_06._M_len = 1;
    __l_06._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_06,(allocator_type *)&local_85);
    break;
  case 0xf:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"objectFieldsEx",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"obj",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"inc_hidden",&local_85);
    __l_16._M_len = 2;
    __l_16._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_16,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x10:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"codepoint",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    __l_05._M_len = 1;
    __l_05._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_05,(allocator_type *)&local_85);
    break;
  case 0x11:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"char",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"n",&local_84);
    __l_21._M_len = 1;
    __l_21._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_21,(allocator_type *)&local_85);
    break;
  case 0x12:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"log",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"n",&local_84);
    __l_27._M_len = 1;
    __l_27._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_27,(allocator_type *)&local_85);
    break;
  case 0x13:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"exp",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"n",&local_84);
    __l_34._M_len = 1;
    __l_34._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_34,(allocator_type *)&local_85);
    break;
  case 0x14:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"mantissa",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"n",&local_84);
    __l_22._M_len = 1;
    __l_22._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_22,(allocator_type *)&local_85);
    break;
  case 0x15:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"exponent",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"n",&local_84);
    __l_24._M_len = 1;
    __l_24._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_24,(allocator_type *)&local_85);
    break;
  case 0x16:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"modulo",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"a",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"b",&local_85);
    __l_32._M_len = 2;
    __l_32._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_32,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x17:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"extVar",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"x",&local_84);
    __l_35._M_len = 1;
    __l_35._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_35,(allocator_type *)&local_85);
    break;
  case 0x18:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"primitiveEquals",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"a",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"b",&local_85);
    __l_14._M_len = 2;
    __l_14._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_14,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x19:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"native",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"name",&local_84);
    __l_13._M_len = 1;
    __l_13._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_13,(allocator_type *)&local_85);
    break;
  case 0x1a:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"md5",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    __l_39._M_len = 1;
    __l_39._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_39,(allocator_type *)&local_85);
    break;
  case 0x1b:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"trace",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"rest",&local_85);
    __l_03._M_len = 2;
    __l_03._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_03,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x1c:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"splitLimit",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"c",&local_85);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (local_40,L"maxsplits",(allocator<char32_t> *)&local_82);
    __l_36._M_len = 3;
    __l_36._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_36,&local_81);
    lVar2 = 0x40;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x1d:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"substr",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"from",&local_85);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (local_40,L"len",(allocator<char32_t> *)&local_82);
    __l_37._M_len = 3;
    __l_37._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_37,&local_81);
    lVar2 = 0x40;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x1e:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"range",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"from",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"to",&local_85);
    __l_30._M_len = 2;
    __l_30._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_30,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x1f:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"strReplace",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"from",&local_85);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (local_40,L"to",(allocator<char32_t> *)&local_82);
    __l_20._M_len = 3;
    __l_20._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_20,&local_81);
    lVar2 = 0x40;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x20:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"asciiLower",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    __l_31._M_len = 1;
    __l_31._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_31,(allocator_type *)&local_85);
    break;
  case 0x21:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"asciiUpper",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    __l_07._M_len = 1;
    __l_07._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_07,(allocator_type *)&local_85);
    break;
  case 0x22:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"join",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"sep",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"arr",&local_85);
    __l_04._M_len = 2;
    __l_04._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_04,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x23:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"parseJson",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    __l_01._M_len = 1;
    __l_01._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_01,(allocator_type *)&local_85);
    break;
  case 0x24:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"parseYaml",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    __l_02._M_len = 1;
    __l_02._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_02,(allocator_type *)&local_85);
    break;
  case 0x25:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"encodeUTF8",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"str",&local_84);
    __l_00._M_len = 1;
    __l_00._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_00,(allocator_type *)&local_85);
    break;
  case 0x26:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"decodeUTF8",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"arr",&local_84);
    __l_38._M_len = 1;
    __l_38._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_38,(allocator_type *)&local_85);
    break;
  case 0x27:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"atan2",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"y",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"x",&local_85);
    __l_33._M_len = 2;
    __l_33._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_33,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  case 0x28:
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)__return_storage_ptr__,L"hypot",&local_83);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_80,L"a",&local_84);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_60,L"b",&local_85);
    __l_10._M_len = 2;
    __l_10._M_array = &local_80;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_10,&local_82);
    lVar2 = 0x20;
    do {
      std::__cxx11::u32string::~u32string((u32string *)((long)&local_80._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    return __return_storage_ptr__;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unrecognized builtin function: "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,builtin);
    std::endl<char,std::char_traits<char>>(poVar1);
    abort();
  }
  std::__cxx11::u32string::~u32string((u32string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

BuiltinDecl jsonnet_builtin_decl(unsigned long builtin)
{
    switch (builtin) {
        case 0: return {U"makeArray", {U"sz", U"func"}};
        case 1: return {U"pow", {U"x", U"n"}};
        case 2: return {U"floor", {U"x"}};
        case 3: return {U"ceil", {U"x"}};
        case 4: return {U"sqrt", {U"x"}};
        case 5: return {U"sin", {U"x"}};
        case 6: return {U"cos", {U"x"}};
        case 7: return {U"tan", {U"x"}};
        case 8: return {U"asin", {U"x"}};
        case 9: return {U"acos", {U"x"}};
        case 10: return {U"atan", {U"x"}};
        case 11: return {U"type", {U"x"}};
        case 12: return {U"filter", {U"func", U"arr"}};
        case 13: return {U"objectHasEx", {U"obj", U"f", U"inc_hidden"}};
        case 14: return {U"length", {U"x"}};
        case 15: return {U"objectFieldsEx", {U"obj", U"inc_hidden"}};
        case 16: return {U"codepoint", {U"str"}};
        case 17: return {U"char", {U"n"}};
        case 18: return {U"log", {U"n"}};
        case 19: return {U"exp", {U"n"}};
        case 20: return {U"mantissa", {U"n"}};
        case 21: return {U"exponent", {U"n"}};
        case 22: return {U"modulo", {U"a", U"b"}};
        case 23: return {U"extVar", {U"x"}};
        case 24: return {U"primitiveEquals", {U"a", U"b"}};
        case 25: return {U"native", {U"name"}};
        case 26: return {U"md5", {U"str"}};
        case 27: return {U"trace", {U"str", U"rest"}};
        case 28: return {U"splitLimit", {U"str", U"c", U"maxsplits"}};
        case 29: return {U"substr", {U"str", U"from", U"len"}};
        case 30: return {U"range", {U"from", U"to"}};
        case 31: return {U"strReplace", {U"str", U"from", U"to"}};
        case 32: return {U"asciiLower", {U"str"}};
        case 33: return {U"asciiUpper", {U"str"}};
        case 34: return {U"join", {U"sep", U"arr"}};
        case 35: return {U"parseJson", {U"str"}};
        case 36: return {U"parseYaml", {U"str"}};
        case 37: return {U"encodeUTF8", {U"str"}};
        case 38: return {U"decodeUTF8", {U"arr"}};
        case 39: return {U"atan2", {U"y", U"x"}};
        case 40: return {U"hypot", {U"a", U"b"}};
        default:
            std::cerr << "INTERNAL ERROR: Unrecognized builtin function: " << builtin << std::endl;
            std::abort();
    }
    // Quiet, compiler.
    return BuiltinDecl();
}